

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# record_property_tests.cpp
# Opt level: O0

void __thiscall iu_RecordTest_x_iutest_x_A_Test::Body(iu_RecordTest_x_iutest_x_A_Test *this)

{
  bool bVar1;
  char *pcVar2;
  TestResult *pTVar3;
  allocator<char> local_bd9;
  string local_bd8;
  AssertionHelper local_bb8;
  Fixed local_b88;
  anon_class_1_0_00000001 local_9f9;
  undefined1 local_9f8 [8];
  AssertionResult iutest_spi_ar_5;
  Fixed local_9a0;
  anon_class_1_0_00000001 local_811;
  undefined1 local_810 [8];
  AssertionResult iutest_spi_ar_4;
  Fixed local_7b8;
  anon_class_1_0_00000001 local_629;
  undefined1 local_628 [8];
  AssertionResult iutest_spi_ar_3;
  Fixed local_5d0;
  anon_class_1_0_00000001 local_441;
  undefined1 local_440 [8];
  AssertionResult iutest_spi_ar_2;
  Fixed local_3e8;
  anon_class_1_0_00000001 local_259;
  undefined1 local_258 [8];
  AssertionResult iutest_spi_ar_1;
  Fixed local_200;
  anon_class_1_0_00000001 local_71;
  undefined1 local_70 [8];
  AssertionResult iutest_spi_ar;
  allocator<char> local_31;
  string local_30;
  iu_RecordTest_x_iutest_x_A_Test *local_10;
  iu_RecordTest_x_iutest_x_A_Test *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"hoge",&local_31);
  iutest::Test::RecordProperty<char[2]>(&local_30,(char (*) [2])0x154b63);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  iutest::detail::AlwaysZero();
  Body::anon_class_1_0_00000001::operator()((AssertionResult *)local_70,&local_71);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    memset(&local_200,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_200);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_70);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_1.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/record_property_tests.cpp"
               ,0x50,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_1.m_result,&local_200);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_1.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_200);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  iutest::detail::AlwaysZero();
  Body::anon_class_1_0_00000001::operator()((AssertionResult *)local_258,&local_259);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_258);
  if (!bVar1) {
    memset(&local_3e8,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_3e8);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_258);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_2.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/record_property_tests.cpp"
               ,0x51,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_2.m_result,&local_3e8);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_2.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_3e8);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_258);
  iutest::detail::AlwaysZero();
  Body::anon_class_1_0_00000001::operator()((AssertionResult *)local_440,&local_441);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_440);
  if (!bVar1) {
    memset(&local_5d0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_5d0);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_440);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_3.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/record_property_tests.cpp"
               ,0x52,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_3.m_result,&local_5d0);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_3.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_5d0);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_440);
  iutest::detail::AlwaysZero();
  Body::anon_class_1_0_00000001::operator()((AssertionResult *)local_628,&local_629);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_628);
  if (!bVar1) {
    memset(&local_7b8,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_7b8);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_628);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_4.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/record_property_tests.cpp"
               ,0x53,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_4.m_result,&local_7b8);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_4.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_7b8);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_628);
  iutest::detail::AlwaysZero();
  Body::anon_class_1_0_00000001::operator()((AssertionResult *)local_810,&local_811);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_810);
  if (!bVar1) {
    memset(&local_9a0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_9a0);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_810);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_5.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/record_property_tests.cpp"
               ,0x54,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_5.m_result,&local_9a0);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_5.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_9a0);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_810);
  iutest::detail::AlwaysZero();
  Body::anon_class_1_0_00000001::operator()((AssertionResult *)local_9f8,&local_9f9);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9f8);
  if (!bVar1) {
    memset(&local_b88,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_b88);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_9f8);
    iutest::AssertionHelper::AssertionHelper
              (&local_bb8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/record_property_tests.cpp"
               ,0x55,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_bb8,&local_b88);
    iutest::AssertionHelper::~AssertionHelper(&local_bb8);
    iutest::AssertionHelper::Fixed::~Fixed(&local_b88);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_9f8);
  pTVar3 = iuutil::GetCurrentTestResult();
  CheckProperty(pTVar3,"hoge","B");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_bd8,"hoge",&local_bd9);
  iutest::Test::RecordProperty<char[2]>(&local_bd8,(char (*) [2])0x1536cc);
  std::__cxx11::string::~string((string *)&local_bd8);
  std::allocator<char>::~allocator(&local_bd9);
  pTVar3 = iuutil::GetCurrentTestResult();
  CheckProperty(pTVar3,"hoge","b");
  return;
}

Assistant:

IUTEST_F(RecordTest, A)
{
    RecordProperty("hoge", "B");
#if !defined(IUTEST_USE_GTEST)
    // ban list
    IUTEST_EXPECT_NONFATAL_FAILURE( RecordProperty("name"       , "B"), "Reserved key");
    IUTEST_EXPECT_NONFATAL_FAILURE( RecordProperty("status"     , "B"), "Reserved key");
    IUTEST_EXPECT_NONFATAL_FAILURE( RecordProperty("time"       , "B"), "Reserved key");
    IUTEST_EXPECT_NONFATAL_FAILURE( RecordProperty("classname"  , "B"), "Reserved key");
    IUTEST_EXPECT_NONFATAL_FAILURE( RecordProperty("type_param" , "B"), "Reserved key");
    IUTEST_EXPECT_NONFATAL_FAILURE( RecordProperty("value_param", "B"), "Reserved key");
#endif
    CheckProperty(::iuutil::GetCurrentTestResult(), "hoge", "B");

    // overwrite
    RecordProperty("hoge", "b");
    CheckProperty(::iuutil::GetCurrentTestResult(), "hoge", "b");
}